

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

PathIntegrator *
phyr::createPathIntegrator
          (shared_ptr<phyr::Sampler> *sampler,shared_ptr<const_phyr::Camera> *camera,int maxDepth)

{
  PathIntegrator *this;
  Bounds2i _pixelBounds;
  shared_ptr<phyr::Sampler> local_70;
  shared_ptr<const_phyr::Camera> local_60;
  Bounds2i local_50;
  string local_40;
  
  local_50 = Film::getSampleBounds
                       (((camera->super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->film);
  if (local_50.pMax.y == local_50.pMin.y || local_50.pMax.x == local_50.pMin.x) {
    formatString<char_const*,int>
              (&local_40,"[%s] \x1b[31;1mERROR(%d):\x1b[0m Degenerate pixel bounds specified\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/methusael13[P]phy-ray/phyray_lib/src/modules/integrators/path.cpp"
               ,0x7a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_40._M_dataplus._M_p,local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    this = (PathIntegrator *)0x0;
  }
  else {
    this = (PathIntegrator *)operator_new(0x70);
    local_60.super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (camera->super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_60.super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (camera->super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_60.super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_60.super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60.super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_60.super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_70.super___shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (sampler->super___shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_70.super___shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (sampler->super___shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_70.super___shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70.super___shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.super___shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70.super___shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.super___shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"spatial","");
    PathIntegrator::PathIntegrator(this,maxDepth,&local_60,&local_70,&local_50,1.0,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (local_70.super___shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<phyr::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_60.super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<const_phyr::Camera,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return this;
}

Assistant:

PathIntegrator* createPathIntegrator(std::shared_ptr<Sampler> sampler,
                                     std::shared_ptr<const Camera> camera,
                                     int maxDepth) {
    Bounds2i _pixelBounds = camera->film->getSampleBounds();

    if (_pixelBounds.area() == 0) {
        LOG_ERR("Degenerate pixel bounds specified");
        return nullptr;
    }

    return new PathIntegrator(maxDepth, camera, sampler, _pixelBounds, 1, "spatial");
}